

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu540c.c
# Opt level: O0

MPP_RET hal_h265e_v540c_ret_task(void *hal,HalEncTask *task)

{
  EncRcTask *pEVar1;
  size_t sVar2;
  RK_U32 offset;
  EncRcTaskInfo *rc_info;
  vepu540c_h265_fbk *fb;
  HalEncTask *enc_task;
  H265eV540cHalContext *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  pEVar1 = task->rc_task;
  sVar2 = mpp_packet_get_length(task->packet);
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) enter\n",(char *)0x0,0x698);
  }
  vepu540c_h265_set_feedback((H265eV540cHalContext *)hal,task);
  mpp_buffer_sync_partial_begin_f
            (task->output,0,(RK_U32)sVar2,*(RK_U32 *)((long)hal + 0x90),"hal_h265e_v540c_ret_task");
  hal_h265e_amend_temporal_id(task,*(RK_U32 *)((long)hal + 0x90));
  (pEVar1->info).sse = *(RK_S64 *)((long)hal + 0x98);
  (pEVar1->info).lvl64_inter_num = *(RK_U32 *)((long)hal + 0xa0);
  (pEVar1->info).lvl32_inter_num = *(RK_U32 *)((long)hal + 0xa4);
  (pEVar1->info).lvl16_inter_num = *(RK_U32 *)((long)hal + 0xa8);
  (pEVar1->info).lvl8_inter_num = *(RK_U32 *)((long)hal + 0xac);
  (pEVar1->info).lvl32_intra_num = *(RK_U32 *)((long)hal + 0xb0);
  (pEVar1->info).lvl16_intra_num = *(RK_U32 *)((long)hal + 0xb4);
  (pEVar1->info).lvl8_intra_num = *(RK_U32 *)((long)hal + 0xb8);
  (pEVar1->info).lvl4_intra_num = *(RK_U32 *)((long)hal + 0xbc);
  task->hw_length = *(RK_S32 *)((long)hal + 0x90);
  task->length = *(int *)((long)hal + 0x90) + task->length;
  if ((hal_h265e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","output stream size %d\n",(char *)0x0,
               (ulong)*(uint *)((long)hal + 0x90));
  }
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) leave\n",(char *)0x0,0x6ad);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v540c_ret_task(void *hal, HalEncTask *task)
{
    H265eV540cHalContext *ctx = (H265eV540cHalContext *)hal;
    HalEncTask *enc_task = task;
    vepu540c_h265_fbk *fb = &ctx->feedback;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 offset = mpp_packet_get_length(enc_task->packet);

    hal_h265e_enter();

    vepu540c_h265_set_feedback(ctx, enc_task);
    mpp_buffer_sync_partial_begin(enc_task->output, offset, fb->out_strm_size);
    hal_h265e_amend_temporal_id(task, fb->out_strm_size);

    rc_info->sse = fb->sse_sum;
    rc_info->lvl64_inter_num = fb->st_lvl64_inter_num;
    rc_info->lvl32_inter_num = fb->st_lvl32_inter_num;
    rc_info->lvl16_inter_num = fb->st_lvl16_inter_num;
    rc_info->lvl8_inter_num  = fb->st_lvl8_inter_num;
    rc_info->lvl32_intra_num = fb->st_lvl32_intra_num;
    rc_info->lvl16_intra_num = fb->st_lvl16_intra_num;
    rc_info->lvl8_intra_num  = fb->st_lvl8_intra_num;
    rc_info->lvl4_intra_num  = fb->st_lvl4_intra_num;

    enc_task->hw_length = fb->out_strm_size;
    enc_task->length += fb->out_strm_size;

    hal_h265e_dbg_detail("output stream size %d\n", fb->out_strm_size);

    hal_h265e_leave();
    return MPP_OK;
}